

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

property_ptr __thiscall
dtc::fdt::device_tree::assign_phandle(device_tree *this,node_ptr *n,uint32_t *phandle)

{
  string *psVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  iterator iVar5;
  property *ppVar6;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  property_ptr pVar8;
  allocator<char> local_1d1;
  device_tree *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [56];
  string local_170;
  property_value v;
  property_value local_f0;
  property_value local_90;
  
  psVar1 = *(string **)phandle;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v,"phandle",(allocator<char> *)local_1a8);
  node::get_property((node *)this,psVar1);
  std::__cxx11::string::~string((string *)&v);
  lVar3._0_4_ = this->phandle_node_name;
  lVar3._4_1_ = this->valid;
  lVar3._5_1_ = this->garbage_collect;
  lVar3._6_2_ = *(undefined2 *)&this->field_0x6;
  _Var7._M_pi = extraout_RDX;
  if (lVar3 == 0) {
    psVar1 = *(string **)phandle;
    local_1d0 = this;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v,"linux,phandle",(allocator<char> *)&local_1c8);
    node::get_property((node *)local_1a8,psVar1);
    this = local_1d0;
    std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)local_1d0,
               (__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
    std::__cxx11::string::~string((string *)&v);
    lVar2._0_4_ = this->phandle_node_name;
    lVar2._4_1_ = this->valid;
    lVar2._5_1_ = this->garbage_collect;
    lVar2._6_2_ = *(undefined2 *)&this->field_0x6;
    _Var7._M_pi = extraout_RDX_00;
    if (lVar2 == 0) {
      local_170._M_dataplus._M_p = local_1a8 + 0x48;
      local_170._M_string_length = 0;
      local_170.field_2._M_local_buf[0] = '\0';
      property_value::property_value(&v,(string *)(local_1a8 + 0x38));
      std::__cxx11::string::~string((string *)(local_1a8 + 0x38));
      while( true ) {
        iVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(n + 0x1a),in_RCX);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_false>
            ._M_cur == (__node_type *)0x0) break;
        *in_RCX = *in_RCX + 1;
      }
      uVar4 = *in_RCX;
      *in_RCX = uVar4 + 1;
      push_big_endian<unsigned_int>(&v.byte_data,uVar4);
      uVar4 = *(uint *)&(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((uVar4 & 0xfffffffd) == 0) {
        ppVar6 = (property *)operator_new(0x78);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"linux,phandle",&local_1d1);
        local_1a8._0_8_ = local_1a8 + 0x30;
        local_1a8._8_8_ = 1;
        local_1a8._16_8_ = (_Hash_node_base *)0x0;
        local_1a8._24_8_ = 0;
        local_1a8._32_8_ = 0x3f800000;
        local_1a8._40_8_ = 0;
        local_1a8._48_8_ = (__node_base_ptr)0x0;
        property::property(ppVar6,&local_1c8,(string_set *)local_1a8);
        std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::reset<dtc::fdt::property>
                  ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)this,ppVar6);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        lVar3 = *(long *)this;
        property_value::property_value(&local_90,&v);
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                   (lVar3 + 0x58),&local_90);
        property_value::~property_value(&local_90);
        std::
        vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
        ::push_back((vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
                     *)(*(long *)phandle + 0x88),(value_type *)this);
        uVar4 = *(uint *)&(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
      }
      if (uVar4 - 1 < 2) {
        ppVar6 = (property *)operator_new(0x78);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"phandle",&local_1d1);
        local_1a8._0_8_ = local_1a8 + 0x30;
        local_1a8._8_8_ = 1;
        local_1a8._16_8_ = (_Hash_node_base *)0x0;
        local_1a8._24_8_ = 0;
        local_1a8._32_8_ = 0x3f800000;
        local_1a8._40_8_ = 0;
        local_1a8._48_8_ = (__node_base_ptr)0x0;
        property::property(ppVar6,&local_1c8,(string_set *)local_1a8);
        std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::reset<dtc::fdt::property>
                  ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)this,ppVar6);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        lVar3 = *(long *)this;
        property_value::property_value(&local_f0,&v);
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                   (lVar3 + 0x58),&local_f0);
        property_value::~property_value(&local_f0);
        std::
        vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
        ::push_back((vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
                     *)(*(long *)phandle + 0x88),(value_type *)this);
      }
      property_value::~property_value(&v);
      _Var7._M_pi = extraout_RDX_01;
    }
  }
  pVar8.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  pVar8.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (property_ptr)pVar8.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

property_ptr
device_tree::assign_phandle(node_ptr n, uint32_t &phandle)
{
	// If there is an existing phandle, use it
	property_ptr p = n->get_property("phandle");
	if (p == 0)
	{
		p = n->get_property("linux,phandle");
	}
	if (p == 0)
	{
		// Otherwise insert a new phandle node
		property_value v;
		while (used_phandles.find(phandle) != used_phandles.end())
		{
			// Note that we only don't need to
			// store this phandle in the set,
			// because we are monotonically
			// increasing the value of phandle and
			// so will only ever revisit this value
			// if we have used 2^32 phandles, at
			// which point our blob won't fit in
			// any 32-bit system and we've done
			// something badly wrong elsewhere
			// already.
			phandle++;
		}
		push_big_endian(v.byte_data, phandle++);
		if (phandle_node_name == BOTH || phandle_node_name == LINUX)
		{
			p.reset(new property("linux,phandle"));
			p->add_value(v);
			n->add_property(p);
		}
		if (phandle_node_name == BOTH || phandle_node_name == EPAPR)
		{
			p.reset(new property("phandle"));
			p->add_value(v);
			n->add_property(p);
		}
	}

	return (p);
}